

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> *node)

{
  pointer pSVar1;
  unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_60;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_58;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_50;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_48 [3];
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_28 [2];
  unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pSVar1 = std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_30,&pSVar1->expr);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>._M_t
              .super__Tuple_impl<0UL,_verilogAST::Slice_*,_std::default_delete<verilogAST::Slice>_>.
              super__Head_base<0UL,_verilogAST::Slice_*,_false>._M_head_impl)->super_Expression).
            super_Node)(local_28,node,&local_30);
  pSVar1 = std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pSVar1->expr,local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_30);
  pSVar1 = std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_50,&pSVar1->high_index);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>._M_t
              .super__Tuple_impl<0UL,_verilogAST::Slice_*,_std::default_delete<verilogAST::Slice>_>.
              super__Head_base<0UL,_verilogAST::Slice_*,_false>._M_head_impl)->super_Expression).
            super_Node)(local_48,node,&local_50);
  pSVar1 = std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pSVar1->high_index,local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_50);
  pSVar1 = std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_60,&pSVar1->low_index);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>._M_t
              .super__Tuple_impl<0UL,_verilogAST::Slice_*,_std::default_delete<verilogAST::Slice>_>.
              super__Head_base<0UL,_verilogAST::Slice_*,_false>._M_head_impl)->super_Expression).
            super_Node)(&local_58,node,&local_60);
  pSVar1 = std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pSVar1->low_index,&local_58);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_58);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_60);
  std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::unique_ptr
            ((unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> *)this,in_RDX);
  return (__uniq_ptr_data<verilogAST::Slice,_std::default_delete<verilogAST::Slice>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Slice,_std::default_delete<verilogAST::Slice>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Slice> Transformer::visit(std::unique_ptr<Slice> node) {
  node->expr = this->visit(std::move(node->expr));
  node->high_index = this->visit(std::move(node->high_index));
  node->low_index = this->visit(std::move(node->low_index));
  return node;
}